

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso3.c
# Opt level: O1

int Gia_Iso3Unique(Vec_Int_t *vSign)

{
  int iVar1;
  int iVar2;
  int *__ptr;
  void *__dest;
  size_t sVar3;
  long lVar4;
  size_t __nmemb;
  
  __ptr = (int *)malloc(0x10);
  iVar2 = vSign->nSize;
  __nmemb = (size_t)iVar2;
  __ptr[1] = iVar2;
  *__ptr = iVar2;
  if (__nmemb == 0) {
    __dest = (void *)0x0;
  }
  else {
    __dest = malloc(__nmemb * 4);
  }
  *(void **)(__ptr + 2) = __dest;
  memcpy(__dest,vSign->pArray,__nmemb * 4);
  if (1 < iVar2) {
    qsort(__dest,__nmemb,4,Vec_IntSortCompare1);
    iVar2 = 1;
    sVar3 = 1;
    do {
      iVar1 = *(int *)((long)__dest + sVar3 * 4);
      if (iVar1 != *(int *)((long)__dest + sVar3 * 4 + -4)) {
        lVar4 = (long)iVar2;
        iVar2 = iVar2 + 1;
        *(int *)((long)__dest + lVar4 * 4) = iVar1;
      }
      sVar3 = sVar3 + 1;
    } while (__nmemb != sVar3);
    __ptr[1] = iVar2;
  }
  iVar2 = __ptr[1];
  if (__dest != (void *)0x0) {
    free(__dest);
    __ptr[2] = 0;
    __ptr[3] = 0;
  }
  free(__ptr);
  return iVar2;
}

Assistant:

int Gia_Iso3Unique( Vec_Int_t * vSign )
{
    int nUnique;
    Vec_Int_t * vCopy = Vec_IntDup( vSign );
    Vec_IntUniqify( vCopy );
    nUnique = Vec_IntSize(vCopy);
    Vec_IntFree( vCopy );
    return nUnique;
}